

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O2

void __thiscall lightconf::writer::newline(writer *this)

{
  _Elt_pointer piVar1;
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"\n",&local_29);
  append(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  piVar1 = (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar1 = (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_28,(char)piVar1[-1]);
  append(this,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  this->line = this->line + 1;
  piVar1 = (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar1 = (this->tabstops).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  this->col = piVar1[-1];
  return;
}

Assistant:

void writer::newline() {
    append("\n");
    append(std::string(tabstops.top(), ' '));
    line++;
    col = tabstops.top();
}